

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O1

char * uo_base64_encode(char *dst,void *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  
  pcVar5 = dst + ((src_len * 4) / 3 + 3 & 0xfffffffffffffffc);
  lVar7 = (long)src + src_len;
  if (src_len % 3 == 2) {
    bVar2 = *(byte *)(lVar7 + -1);
    bVar1 = *(byte *)(lVar7 + -2);
    lVar7 = lVar7 + -2;
    pcVar5[-1] = '=';
    pcVar5[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ulong)(bVar2 & 0xf) * 4];
    uVar6 = (uint)(bVar2 >> 4) | (bVar1 & 3) << 4;
  }
  else {
    pcVar4 = pcVar5;
    if (src_len % 3 != 1) goto LAB_00101432;
    bVar1 = *(byte *)(lVar7 + -1);
    lVar7 = lVar7 + -1;
    pcVar5[-2] = '=';
    pcVar5[-1] = '=';
    uVar6 = (bVar1 & 3) << 4;
  }
  pcVar5[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar6];
  pcVar5[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
  pcVar4 = pcVar5 + -4;
LAB_00101432:
  if (dst < pcVar4) {
    pbVar8 = (byte *)(lVar7 + -1);
    do {
      bVar2 = *pbVar8;
      bVar1 = pbVar8[-1];
      bVar3 = pbVar8[-2];
      pcVar4[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 & 0x3f];
      pcVar4[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(bVar2 >> 6) + (bVar1 & 0xf) * 4];
      pcVar4[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(bVar1 >> 4) | (bVar3 & 3) << 4];
      pcVar4[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 >> 2];
      pcVar4 = pcVar4 + -4;
      pbVar8 = pbVar8 + -3;
    } while (dst < pcVar4);
  }
  return pcVar5;
}

Assistant:

char *uo_base64_encode(
    char *dst, 
    const void *src, 
    size_t src_len)
{
    unsigned char *end = dst + ((src_len * 4 / 3 + 3) & ~3);
    unsigned char *a = end;
    const unsigned char *b = (unsigned char *)src + src_len;
    unsigned char b0, b1, b2;

    switch (src_len % 3)
    {
        case 1:
            b0 = *--b;

            *--a = '=';
            *--a = '=';
            *--a = btoa[(b0 & 0x03) << 4];
            *--a = btoa[b0 >> 2];

            break;

        case 2:
            b1 = *--b;
            b0 = *--b;
            
            *--a = '=';
            *--a = btoa[(b1 & 0x0F) << 2];
            *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
            *--a = btoa[b0 >> 2];

            break;
    }

    while ((char *)a > dst)
    {
        b2 = *--b;
        b1 = *--b;
        b0 = *--b;
        
        *--a = btoa[b2 & 0x3F];
        *--a = btoa[(b1 & 0x0F) << 2 | b2 >> 6];
        *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
        *--a = btoa[b0 >> 2];
    }

    return end;
}